

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateViewportsNewFrame(void)

{
  float *pfVar1;
  float fVar2;
  ImGuiViewportP *pIVar3;
  ImGuiViewportP *viewport_00;
  ImGuiContext *pIVar4;
  bool bVar5;
  byte bVar6;
  ImGuiViewportP **ppIVar7;
  ImGuiPlatformMonitor *pIVar8;
  bool bVar9;
  ImVec2 IVar10;
  ImGuiViewportP *local_a0;
  float local_98;
  ImGuiViewportP *pIStack_90;
  bool is_mouse_dragging_with_an_expected_destination;
  ImGuiViewportP *viewport_hovered;
  ImGuiPlatformMonitor *monitor;
  float local_78;
  float scale_factor;
  float new_dpi_scale;
  ImVec2 viewport_delta_pos;
  bool platform_funcs_available_1;
  ImGuiViewportP *viewport_1;
  ImVec2 IStack_40;
  int n_1;
  ImVec2 main_viewport_size;
  ImVec2 main_viewport_pos;
  ImGuiViewportP *main_viewport;
  bool minimized;
  bool platform_funcs_available;
  ImGuiViewportP *viewport;
  int n;
  bool viewports_enabled;
  ImGuiContext *g;
  
  pIVar4 = GImGui;
  if ((GImGui->Viewports).Size < (GImGui->PlatformIO).Viewports.Size) {
    __assert_fail("g.PlatformIO.Viewports.Size <= g.Viewports.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x31c5,"void ImGui::UpdateViewportsNewFrame()");
  }
  bVar9 = (GImGui->ConfigFlagsCurrFrame & 0x400U) != 0;
  if (bVar9) {
    for (viewport._0_4_ = 0; (int)viewport < (pIVar4->Viewports).Size;
        viewport._0_4_ = (int)viewport + 1) {
      ppIVar7 = ImVector<ImGuiViewportP_*>::operator[](&pIVar4->Viewports,(int)viewport);
      pIVar3 = *ppIVar7;
      if (((pIVar4->PlatformIO).Platform_GetWindowMinimized != (_func_bool_ImGuiViewport_ptr *)0x0)
         && ((pIVar3->PlatformWindowCreated & 1U) != 0)) {
        bVar5 = (*(pIVar4->PlatformIO).Platform_GetWindowMinimized)(&pIVar3->super_ImGuiViewport);
        if (bVar5) {
          (pIVar3->super_ImGuiViewport).Flags = (pIVar3->super_ImGuiViewport).Flags | 0x400;
        }
        else {
          (pIVar3->super_ImGuiViewport).Flags = (pIVar3->super_ImGuiViewport).Flags & 0xfffffbff;
        }
      }
    }
  }
  ppIVar7 = ImVector<ImGuiViewportP_*>::operator[](&pIVar4->Viewports,0);
  pIVar3 = *ppIVar7;
  if ((pIVar3->super_ImGuiViewport).ID != 0x11111111) {
    __assert_fail("main_viewport->ID == IMGUI_VIEWPORT_DEFAULT_ID",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x31dd,"void ImGui::UpdateViewportsNewFrame()");
  }
  if (pIVar3->Window != (ImGuiWindow *)0x0) {
    __assert_fail("main_viewport->Window == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0x31de,"void ImGui::UpdateViewportsNewFrame()");
  }
  if (bVar9) {
    main_viewport_size = (*(pIVar4->PlatformIO).Platform_GetWindowPos)(&pIVar3->super_ImGuiViewport)
    ;
  }
  else {
    ImVec2::ImVec2(&main_viewport_size,0.0,0.0);
  }
  IStack_40 = (pIVar4->IO).DisplaySize;
  if ((bVar9) && (((pIVar3->super_ImGuiViewport).Flags & 0x400U) != 0)) {
    main_viewport_size = (pIVar3->super_ImGuiViewport).Pos;
    IStack_40 = (pIVar3->super_ImGuiViewport).Size;
  }
  AddUpdateViewport((ImGuiWindow *)0x0,0x11111111,&main_viewport_size,&stack0xffffffffffffffc0,
                    0x1004);
  pIVar4->CurrentDpiScale = 0.0;
  pIVar4->CurrentViewport = (ImGuiViewportP *)0x0;
  pIVar4->MouseViewport = (ImGuiViewportP *)0x0;
  viewport_1._4_4_ = 0;
  do {
    if ((pIVar4->Viewports).Size <= viewport_1._4_4_) {
      if ((pIVar4->PlatformIO).Monitors.Size == 0) {
        (pIVar4->FallbackMonitor).MainPos = (pIVar3->super_ImGuiViewport).Pos;
        (pIVar4->FallbackMonitor).MainSize = (pIVar3->super_ImGuiViewport).Size;
        (pIVar4->FallbackMonitor).WorkPos = (pIVar3->super_ImGuiViewport).WorkPos;
        (pIVar4->FallbackMonitor).WorkSize = (pIVar3->super_ImGuiViewport).WorkSize;
        (pIVar4->FallbackMonitor).DpiScale = (pIVar3->super_ImGuiViewport).DpiScale;
      }
      if (bVar9) {
        if (((pIVar4->IO).BackendFlags & 0x800U) == 0) {
          pIStack_90 = FindHoveredViewportFromPlatformWindowStack(&(pIVar4->IO).MousePos);
        }
        else {
          if ((pIVar4->IO).MouseHoveredViewport == 0) {
            local_a0 = (ImGuiViewportP *)0x0;
          }
          else {
            local_a0 = (ImGuiViewportP *)FindViewportByID((pIVar4->IO).MouseHoveredViewport);
          }
          pIStack_90 = local_a0;
          if ((local_a0 != (ImGuiViewportP *)0x0) &&
             (((local_a0->super_ImGuiViewport).Flags & 0x80U) != 0)) {
            pIStack_90 = FindHoveredViewportFromPlatformWindowStack(&(pIVar4->IO).MousePos);
          }
        }
        if (pIStack_90 == (ImGuiViewportP *)0x0) {
          if (pIVar4->MouseLastHoveredViewport == (ImGuiViewportP *)0x0) {
            ppIVar7 = ImVector<ImGuiViewportP_*>::operator[](&pIVar4->Viewports,0);
            pIVar4->MouseLastHoveredViewport = *ppIVar7;
          }
        }
        else {
          pIVar4->MouseLastHoveredViewport = pIStack_90;
        }
        if ((pIVar4->MovingWindow == (ImGuiWindow *)0x0) ||
           (pIVar4->MovingWindow->Viewport == (ImGuiViewportP *)0x0)) {
          pIVar4->MouseViewport = pIVar4->MouseLastHoveredViewport;
        }
        else {
          pIVar4->MouseViewport = pIVar4->MovingWindow->Viewport;
        }
        bVar6 = pIVar4->DragDropActive & 1;
        if ((bVar6 != 0) && (pIStack_90 == (ImGuiViewportP *)0x0)) {
          pIStack_90 = pIVar4->MouseLastHoveredViewport;
        }
        if ((((bVar6 != 0) || (pIVar4->ActiveId == 0)) || (bVar9 = IsAnyMouseDown(), !bVar9)) &&
           (((pIStack_90 != (ImGuiViewportP *)0x0 && (pIStack_90 != pIVar4->MouseViewport)) &&
            (((pIStack_90->super_ImGuiViewport).Flags & 0x80U) == 0)))) {
          pIVar4->MouseViewport = pIStack_90;
        }
        if (pIVar4->MouseViewport == (ImGuiViewportP *)0x0) {
          __assert_fail("g.MouseViewport != __null",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                        ,0x326d,"void ImGui::UpdateViewportsNewFrame()");
        }
      }
      else {
        pIVar4->MouseViewport = pIVar3;
      }
      return;
    }
    ppIVar7 = ImVector<ImGuiViewportP_*>::operator[](&pIVar4->Viewports,viewport_1._4_4_);
    viewport_00 = *ppIVar7;
    *(int *)&(viewport_00->super_ImGuiViewport).field_0x5c = viewport_1._4_4_;
    if ((viewport_1._4_4_ < 1) || (pIVar4->FrameCount + -2 <= viewport_00->LastFrameActive)) {
      bVar6 = viewport_00->PlatformWindowCreated & 1;
      if ((bVar9) && ((((viewport_00->super_ImGuiViewport).Flags & 0x400U) == 0 && (bVar6 != 0)))) {
        if (((viewport_00->super_ImGuiViewport).PlatformRequestMove & 1U) != 0) {
          IVar10 = (*(pIVar4->PlatformIO).Platform_GetWindowPos)(&viewport_00->super_ImGuiViewport);
          viewport_00->LastPlatformPos = IVar10;
          (viewport_00->super_ImGuiViewport).Pos = viewport_00->LastPlatformPos;
        }
        if (((viewport_00->super_ImGuiViewport).PlatformRequestResize & 1U) != 0) {
          IVar10 = (*(pIVar4->PlatformIO).Platform_GetWindowSize)(&viewport_00->super_ImGuiViewport)
          ;
          viewport_00->LastPlatformSize = IVar10;
          (viewport_00->super_ImGuiViewport).Size = viewport_00->LastPlatformSize;
        }
      }
      UpdateViewportPlatformMonitor(viewport_00);
      viewport_00->WorkOffsetMin = viewport_00->BuildWorkOffsetMin;
      viewport_00->WorkOffsetMax = viewport_00->BuildWorkOffsetMax;
      ImVec2::ImVec2(&viewport_delta_pos,0.0,0.0);
      viewport_00->BuildWorkOffsetMax = viewport_delta_pos;
      viewport_00->BuildWorkOffsetMin = viewport_00->BuildWorkOffsetMax;
      ImGuiViewportP::UpdateWorkRect(viewport_00);
      viewport_00->Alpha = 1.0;
      IVar10 = ::operator-(&(viewport_00->super_ImGuiViewport).Pos,&viewport_00->LastPos);
      if (((viewport_00->super_ImGuiViewport).Flags & 0x1000U) != 0) {
        scale_factor = IVar10.x;
        if ((scale_factor == 0.0) && (!NAN(scale_factor))) {
          new_dpi_scale = IVar10.y;
          if ((new_dpi_scale == 0.0) && (!NAN(new_dpi_scale))) goto LAB_0019d3d5;
        }
        TranslateWindowsInViewport
                  (viewport_00,&viewport_00->LastPos,&(viewport_00->super_ImGuiViewport).Pos);
      }
LAB_0019d3d5:
      if (((pIVar4->PlatformIO).Platform_GetWindowDpiScale == (_func_float_ImGuiViewport_ptr *)0x0)
         || (bVar6 == 0)) {
        if (viewport_00->PlatformMonitor == -1) {
          fVar2 = (viewport_00->super_ImGuiViewport).DpiScale;
          if ((fVar2 != 0.0) || (NAN(fVar2))) {
            local_98 = (viewport_00->super_ImGuiViewport).DpiScale;
          }
          else {
            local_98 = 1.0;
          }
          local_78 = local_98;
        }
        else {
          pIVar8 = ImVector<ImGuiPlatformMonitor>::operator[]
                             (&(pIVar4->PlatformIO).Monitors,(int)viewport_00->PlatformMonitor);
          local_78 = pIVar8->DpiScale;
        }
      }
      else {
        local_78 = (*(pIVar4->PlatformIO).Platform_GetWindowDpiScale)
                             (&viewport_00->super_ImGuiViewport);
      }
      fVar2 = (viewport_00->super_ImGuiViewport).DpiScale;
      if ((((fVar2 != 0.0) || (NAN(fVar2))) &&
          ((pfVar1 = &(viewport_00->super_ImGuiViewport).DpiScale, local_78 != *pfVar1 ||
           (NAN(local_78) || NAN(*pfVar1))))) && (((pIVar4->IO).ConfigFlags & 0x4000U) != 0)) {
        ScaleWindowsInViewport(viewport_00,local_78 / (viewport_00->super_ImGuiViewport).DpiScale);
      }
      (viewport_00->super_ImGuiViewport).DpiScale = local_78;
    }
    else {
      DestroyViewport(viewport_00);
      viewport_1._4_4_ = viewport_1._4_4_ + -1;
    }
    viewport_1._4_4_ = viewport_1._4_4_ + 1;
  } while( true );
}

Assistant:

static void ImGui::UpdateViewportsNewFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.PlatformIO.Viewports.Size <= g.Viewports.Size);

    // Update Minimized status (we need it first in order to decide if we'll apply Pos/Size of the main viewport)
    const bool viewports_enabled = (g.ConfigFlagsCurrFrame & ImGuiConfigFlags_ViewportsEnable) != 0;
    if (viewports_enabled)
    {
        for (int n = 0; n < g.Viewports.Size; n++)
        {
            ImGuiViewportP* viewport = g.Viewports[n];
            const bool platform_funcs_available = viewport->PlatformWindowCreated;
            if (g.PlatformIO.Platform_GetWindowMinimized && platform_funcs_available)
            {
                bool minimized = g.PlatformIO.Platform_GetWindowMinimized(viewport);
                if (minimized)
                    viewport->Flags |= ImGuiViewportFlags_Minimized;
                else
                    viewport->Flags &= ~ImGuiViewportFlags_Minimized;
            }
        }
    }

    // Create/update main viewport with current platform position.
    // FIXME-VIEWPORT: Size is driven by backend/user code for backward-compatibility but we should aim to make this more consistent.
    ImGuiViewportP* main_viewport = g.Viewports[0];
    IM_ASSERT(main_viewport->ID == IMGUI_VIEWPORT_DEFAULT_ID);
    IM_ASSERT(main_viewport->Window == NULL);
    ImVec2 main_viewport_pos = viewports_enabled ? g.PlatformIO.Platform_GetWindowPos(main_viewport) : ImVec2(0.0f, 0.0f);
    ImVec2 main_viewport_size = g.IO.DisplaySize;
    if (viewports_enabled && (main_viewport->Flags & ImGuiViewportFlags_Minimized))
    {
        main_viewport_pos = main_viewport->Pos;    // Preserve last pos/size when minimized (FIXME: We don't do the same for Size outside of the viewport path)
        main_viewport_size = main_viewport->Size;
    }
    AddUpdateViewport(NULL, IMGUI_VIEWPORT_DEFAULT_ID, main_viewport_pos, main_viewport_size, ImGuiViewportFlags_OwnedByApp | ImGuiViewportFlags_CanHostOtherWindows);

    g.CurrentDpiScale = 0.0f;
    g.CurrentViewport = NULL;
    g.MouseViewport = NULL;
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->Idx = n;

        // Erase unused viewports
        if (n > 0 && viewport->LastFrameActive < g.FrameCount - 2)
        {
            DestroyViewport(viewport);
            n--;
            continue;
        }

        const bool platform_funcs_available = viewport->PlatformWindowCreated;
        if (viewports_enabled)
        {
            // Update Position and Size (from Platform Window to ImGui) if requested.
            // We do it early in the frame instead of waiting for UpdatePlatformWindows() to avoid a frame of lag when moving/resizing using OS facilities.
            if (!(viewport->Flags & ImGuiViewportFlags_Minimized) && platform_funcs_available)
            {
                // Viewport->WorkPos and WorkSize will be updated below
                if (viewport->PlatformRequestMove)
                    viewport->Pos = viewport->LastPlatformPos = g.PlatformIO.Platform_GetWindowPos(viewport);
                if (viewport->PlatformRequestResize)
                    viewport->Size = viewport->LastPlatformSize = g.PlatformIO.Platform_GetWindowSize(viewport);
            }
        }

        // Update/copy monitor info
        UpdateViewportPlatformMonitor(viewport);

        // Lock down space taken by menu bars and status bars, reset the offset for functions like BeginMainMenuBar() to alter them again.
        viewport->WorkOffsetMin = viewport->BuildWorkOffsetMin;
        viewport->WorkOffsetMax = viewport->BuildWorkOffsetMax;
        viewport->BuildWorkOffsetMin = viewport->BuildWorkOffsetMax = ImVec2(0.0f, 0.0f);
        viewport->UpdateWorkRect();

        // Reset alpha every frame. Users of transparency (docking) needs to request a lower alpha back.
        viewport->Alpha = 1.0f;

        // Translate Dear ImGui windows when a Host Viewport has been moved
        // (This additionally keeps windows at the same place when ImGuiConfigFlags_ViewportsEnable is toggled!)
        const ImVec2 viewport_delta_pos = viewport->Pos - viewport->LastPos;
        if ((viewport->Flags & ImGuiViewportFlags_CanHostOtherWindows) && (viewport_delta_pos.x != 0.0f || viewport_delta_pos.y != 0.0f))
            TranslateWindowsInViewport(viewport, viewport->LastPos, viewport->Pos);

        // Update DPI scale
        float new_dpi_scale;
        if (g.PlatformIO.Platform_GetWindowDpiScale && platform_funcs_available)
            new_dpi_scale = g.PlatformIO.Platform_GetWindowDpiScale(viewport);
        else if (viewport->PlatformMonitor != -1)
            new_dpi_scale = g.PlatformIO.Monitors[viewport->PlatformMonitor].DpiScale;
        else
            new_dpi_scale = (viewport->DpiScale != 0.0f) ? viewport->DpiScale : 1.0f;
        if (viewport->DpiScale != 0.0f && new_dpi_scale != viewport->DpiScale)
        {
            float scale_factor = new_dpi_scale / viewport->DpiScale;
            if (g.IO.ConfigFlags & ImGuiConfigFlags_DpiEnableScaleViewports)
                ScaleWindowsInViewport(viewport, scale_factor);
            //if (viewport == GetMainViewport())
            //    g.PlatformInterface.SetWindowSize(viewport, viewport->Size * scale_factor);

            // Scale our window moving pivot so that the window will rescale roughly around the mouse position.
            // FIXME-VIEWPORT: This currently creates a resizing feedback loop when a window is straddling a DPI transition border.
            // (Minor: since our sizes do not perfectly linearly scale, deferring the click offset scale until we know the actual window scale ratio may get us slightly more precise mouse positioning.)
            //if (g.MovingWindow != NULL && g.MovingWindow->Viewport == viewport)
            //    g.ActiveIdClickOffset = ImFloor(g.ActiveIdClickOffset * scale_factor);
        }
        viewport->DpiScale = new_dpi_scale;
    }

    // Update fallback monitor
    if (g.PlatformIO.Monitors.Size == 0)
    {
        ImGuiPlatformMonitor* monitor = &g.FallbackMonitor;
        monitor->MainPos = main_viewport->Pos;
        monitor->MainSize = main_viewport->Size;
        monitor->WorkPos = main_viewport->WorkPos;
        monitor->WorkSize = main_viewport->WorkSize;
        monitor->DpiScale = main_viewport->DpiScale;
    }

    if (!viewports_enabled)
    {
        g.MouseViewport = main_viewport;
        return;
    }

    // Mouse handling: decide on the actual mouse viewport for this frame between the active/focused viewport and the hovered viewport.
    // Note that 'viewport_hovered' should skip over any viewport that has the ImGuiViewportFlags_NoInputs flags set.
    ImGuiViewportP* viewport_hovered = NULL;
    if (g.IO.BackendFlags & ImGuiBackendFlags_HasMouseHoveredViewport)
    {
        viewport_hovered = g.IO.MouseHoveredViewport ? (ImGuiViewportP*)FindViewportByID(g.IO.MouseHoveredViewport) : NULL;
        if (viewport_hovered && (viewport_hovered->Flags & ImGuiViewportFlags_NoInputs))
            viewport_hovered = FindHoveredViewportFromPlatformWindowStack(g.IO.MousePos); // Backend failed to handle _NoInputs viewport: revert to our fallback.
    }
    else
    {
        // If the backend doesn't know how to honor ImGuiViewportFlags_NoInputs, we do a search ourselves. Note that this search:
        // A) won't take account of the possibility that non-imgui windows may be in-between our dragged window and our target window.
        // B) won't take account of how the backend apply parent<>child relationship to secondary viewports, which affects their Z order.
        // C) uses LastFrameAsRefViewport as a flawed replacement for the last time a window was focused (we could/should fix that by introducing Focus functions in PlatformIO)
        viewport_hovered = FindHoveredViewportFromPlatformWindowStack(g.IO.MousePos);
    }
    if (viewport_hovered != NULL)
        g.MouseLastHoveredViewport = viewport_hovered;
    else if (g.MouseLastHoveredViewport == NULL)
        g.MouseLastHoveredViewport = g.Viewports[0];

    // Update mouse reference viewport
    // (when moving a window we aim at its viewport, but this will be overwritten below if we go in drag and drop mode)
    // (MovingViewport->Viewport will be NULL in the rare situation where the window disappared while moving, set UpdateMouseMovingWindowNewFrame() for details)
    if (g.MovingWindow && g.MovingWindow->Viewport)
        g.MouseViewport = g.MovingWindow->Viewport;
    else
        g.MouseViewport = g.MouseLastHoveredViewport;

    // When dragging something, always refer to the last hovered viewport.
    // - when releasing a moving window we will revert to aiming behind (at viewport_hovered)
    // - when we are between viewports, our dragged preview will tend to show in the last viewport _even_ if we don't have tooltips in their viewports (when lacking monitor info)
    // - consider the case of holding on a menu item to browse child menus: even thou a mouse button is held, there's no active id because menu items only react on mouse release.
    // FIXME-VIEWPORT: This is essentially broken, when ImGuiBackendFlags_HasMouseHoveredViewport is set we want to trust when viewport_hovered==NULL and use that.
    const bool is_mouse_dragging_with_an_expected_destination = g.DragDropActive;
    if (is_mouse_dragging_with_an_expected_destination && viewport_hovered == NULL)
        viewport_hovered = g.MouseLastHoveredViewport;
    if (is_mouse_dragging_with_an_expected_destination || g.ActiveId == 0 || !IsAnyMouseDown())
        if (viewport_hovered != NULL && viewport_hovered != g.MouseViewport && !(viewport_hovered->Flags & ImGuiViewportFlags_NoInputs))
            g.MouseViewport = viewport_hovered;

    IM_ASSERT(g.MouseViewport != NULL);
}